

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidRandomUniformDistributionWrongMinMax(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_long> *this;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  ostream *poVar13;
  string *psVar14;
  long lVar15;
  unsigned_long *puVar16;
  LayerUnion LVar17;
  undefined8 *puVar18;
  int iVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar21;
  uint uVar22;
  Model m;
  Result res3;
  Result res2;
  Result res1;
  Model local_d0;
  Result local_a0;
  Result local_78;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_d0,(Arena *)0x0,false);
  if (local_d0.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(local_d0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_d0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_d0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar3 = ((local_d0.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00195f7b:
    pRVar20 = &(local_d0.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar19 = ((local_d0.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar19) goto LAB_00195f7b;
    ((local_d0.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar3->elements[iVar19];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar18);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar22 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 5;
  }
  uVar22 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_d0.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(local_d0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_d0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_d0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar3 = ((local_d0.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00196138:
    pRVar20 = &(local_d0.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar19 = ((local_d0.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar19) goto LAB_00196138;
    ((local_d0.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar3->elements[iVar19];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar18);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar22 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 5;
  }
  uVar22 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar22] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_d0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_d0);
    local_d0._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(local_d0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_d0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_d0.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  (local_d0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_d0.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00196315:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_d0.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar10);
  }
  else {
    iVar19 = (local_d0.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar19) goto LAB_00196315;
    (local_d0.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar19 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar19];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019634d:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar19 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar19) goto LAB_0019634d;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar3->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019639d:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar19 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar19) goto LAB_0019639d;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar3->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3bbdaf);
  if (pNVar10->_oneof_case_[0] == 0x4a6) {
    LVar17 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x4a6;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    LVar17.randomuniformlike_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::RandomUniformLikeLayerParams>(pAVar21);
    (pNVar10->layer_).randomuniformlike_ = (RandomUniformLikeLayerParams *)LVar17;
  }
  (LVar17.innerproduct_)->bias_ = (WeightParams *)0x3ecccccd3f99999a;
  CoreML::validate<(MLModelType)500>(&local_50,&local_d0);
  bVar5 = CoreML::Result::good(&local_50);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x162b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  }
  else {
    psVar14 = CoreML::Result::message_abi_cxx11_(&local_50);
    lVar15 = std::__cxx11::string::find((char *)psVar14,0x397fdc,0);
    if (lVar15 != -1) {
      if (pNVar10->_oneof_case_[0] == 0x4ab) {
        LVar17 = pNVar10->layer_;
      }
      else {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
        pNVar10->_oneof_case_[0] = 0x4ab;
        uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
        pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
        if ((uVar4 & 1) != 0) {
          pAVar21 = *(Arena **)pAVar21;
        }
        LVar17.randomuniformstatic_ =
             google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::RandomUniformStaticLayerParams>(pAVar21);
        (pNVar10->layer_).randomuniformstatic_ = (RandomUniformStaticLayerParams *)LVar17;
      }
      this = &(LVar17.convolution_)->kernelsize_;
      uVar2 = ((LVar17.convolution_)->kernelsize_).current_size_;
      if (uVar2 == ((LVar17.convolution_)->kernelsize_).total_size_) {
        google::protobuf::RepeatedField<unsigned_long>::Reserve(this,uVar2 + 1);
        puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(this);
        puVar16[uVar2] = 3;
      }
      else {
        puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(this);
        puVar16[uVar2] = 3;
      }
      ((LVar17.convolution_)->kernelsize_).current_size_ = uVar2 + 1;
      (LVar17.cropresize_)->boxindicesmode_ = (BoxCoordinatesMode *)0x3ecccccd3f99999a;
      CoreML::validate<(MLModelType)500>(&local_78,&local_d0);
      bVar5 = CoreML::Result::good(&local_78);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1634);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
LAB_001967f2:
        std::ostream::put((char)poVar13);
        iVar19 = 1;
        std::ostream::flush();
      }
      else {
        psVar14 = CoreML::Result::message_abi_cxx11_(&local_78);
        lVar15 = std::__cxx11::string::find((char *)psVar14,0x397fdc,0);
        if (lVar15 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1635);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"res2.message().find(\"smaller\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          goto LAB_001967f2;
        }
        if (pNVar10->_oneof_case_[0] == 0x4b0) {
          LVar17 = pNVar10->layer_;
        }
        else {
          CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
          pNVar10->_oneof_case_[0] = 0x4b0;
          uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
          pAVar21 = (Arena *)(uVar4 & 0xfffffffffffffffc);
          if ((uVar4 & 1) != 0) {
            pAVar21 = *(Arena **)pAVar21;
          }
          LVar17.randomuniformdynamic_ =
               google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::RandomUniformDynamicLayerParams>(pAVar21);
          (pNVar10->layer_).randomuniformdynamic_ = (RandomUniformDynamicLayerParams *)LVar17;
        }
        (LVar17.innerproduct_)->bias_ = (WeightParams *)0x3ecccccd3f99999a;
        CoreML::validate<(MLModelType)500>(&local_a0,&local_d0);
        bVar5 = CoreML::Result::good(&local_a0);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x163c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          iVar19 = 1;
          std::ostream::flush();
        }
        else {
          psVar14 = CoreML::Result::message_abi_cxx11_(&local_a0);
          iVar19 = 0;
          lVar15 = std::__cxx11::string::find((char *)psVar14,0x397fdc,0);
          if (lVar15 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x163d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"res3.message().find(\"smaller\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13," was false, expected true.",0x1a);
            iVar19 = 1;
            std::endl<char,std::char_traits<char>>(poVar13);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.m_message._M_dataplus._M_p != &local_a0.m_message.field_2) {
          operator_delete(local_a0.m_message._M_dataplus._M_p,
                          local_a0.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
        operator_delete(local_78.m_message._M_dataplus._M_p,
                        local_78.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00196a0e;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x162c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"res1.message().find(\"smaller\") != std::string::npos",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  }
  std::ostream::put((char)poVar13);
  iVar19 = 1;
  std::ostream::flush();
LAB_00196a0e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_d0);
  return iVar19;
}

Assistant:

int testInvalidRandomUniformDistributionWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_randomuniformlike();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    auto* params2 = layers->mutable_randomuniformstatic();
    params2->add_outputshape(3);
    params2->set_minval(1.2f);
    params2->set_maxval(0.4f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("smaller") != std::string::npos);

    auto* params3 = layers->mutable_randomuniformdynamic();
    params3->set_minval(1.2f);
    params3->set_maxval(0.4f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("smaller") != std::string::npos);

    return 0;
}